

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_catalog.cpp
# Opt level: O0

void __thiscall
duckdb::DuckCatalog::DropSchema(DuckCatalog *this,CatalogTransaction transaction,DropInfo *info)

{
  QueryErrorContext context;
  bool bVar1;
  pointer pCVar2;
  undefined8 uVar3;
  string *in_RSI;
  CatalogSet *in_RDI;
  CatalogTransaction in_stack_00000010;
  unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>
  *in_stack_ffffffffffffff40;
  string *suggestion;
  string *name;
  CatalogType type;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffff8c;
  optional_idx local_68;
  QueryErrorContext local_60;
  string local_58 [32];
  undefined1 local_38 [38];
  undefined1 in_stack_ffffffffffffffee;
  undefined1 in_stack_ffffffffffffffef;
  
  name = (string *)&stack0x00000008;
  pCVar2 = unique_ptr<duckdb::CatalogSet,_std::default_delete<duckdb::CatalogSet>,_true>::operator->
                     (in_stack_ffffffffffffff40);
  type = (CatalogType)((ulong)pCVar2 >> 0x38);
  memcpy(local_38,name,0x28);
  bVar1 = CatalogSet::DropEntry
                    (in_RDI,in_stack_00000010,in_RSI,(bool)in_stack_ffffffffffffffef,
                     (bool)in_stack_ffffffffffffffee);
  if ((!bVar1) && (in_RSI[3].field_2._M_local_buf[0] == '\0')) {
    uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffff88);
    uVar3 = __cxa_allocate_exception(0x10);
    suggestion = (string *)&in_RSI[2].field_2;
    ::std::__cxx11::string::string(local_58);
    optional_idx::optional_idx(&local_68);
    QueryErrorContext::QueryErrorContext(&local_60,local_68);
    context.query_location.index._4_4_ = in_stack_ffffffffffffff8c;
    context.query_location.index._0_4_ = uVar4;
    CatalogException::MissingEntry(type,name,suggestion,context);
    __cxa_throw(uVar3,&CatalogException::typeinfo,CatalogException::~CatalogException);
  }
  return;
}

Assistant:

void DuckCatalog::DropSchema(CatalogTransaction transaction, DropInfo &info) {
	D_ASSERT(!info.name.empty());
	if (!schemas->DropEntry(transaction, info.name, info.cascade)) {
		if (info.if_not_found == OnEntryNotFound::THROW_EXCEPTION) {
			throw CatalogException::MissingEntry(CatalogType::SCHEMA_ENTRY, info.name, string());
		}
	}
}